

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O3

int ConnectRazorAHRS(RAZORAHRS *pRazorAHRS,char *szCfgFilePath)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  size_t sVar4;
  ssize_t sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  char line [256];
  char calibbuf [2048];
  byte local_a98;
  char local_a97;
  double *local_990;
  double *local_988;
  double *local_980;
  double *local_978;
  double dStack_970;
  int *local_960;
  BOOL *local_958;
  BOOL *local_950;
  BOOL *local_948;
  double *local_940;
  double *local_938;
  double *local_930;
  double *local_928;
  double *local_920;
  double *local_918;
  double *local_910;
  double *local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  BOOL *local_8e0;
  double *local_8d8;
  double *local_8d0;
  double *local_8c8;
  double *local_8c0;
  double *local_8b8;
  double *local_8b0;
  double *local_8a8;
  double *local_8a0;
  double *local_898;
  double *local_890;
  double *local_888;
  double *local_880;
  double *local_878;
  double *local_870;
  double *local_868;
  double *local_860;
  double *local_858;
  double *local_850;
  double *local_848;
  double *local_840;
  char local_838 [2056];
  
  memset(pRazorAHRS->szCfgFilePath,0,0x100);
  sprintf(pRazorAHRS->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_a98,0,0x100);
    memset(pRazorAHRS->szDevPath + 5,0,0xfb);
    builtin_strncpy(pRazorAHRS->szDevPath,"COM1",5);
    pRazorAHRS->BaudRate = 0xe100;
    pRazorAHRS->timeout = 2000;
    pRazorAHRS->threadperiod = 0x32;
    pRazorAHRS->bSaveRawData = 1;
    pRazorAHRS->bROSMode = 1;
    *(undefined8 *)&pRazorAHRS->bSendCalibration = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_x_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_x_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_y_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_y_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_z_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->accel_z_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_x_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_x_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_y_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_y_max + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_z_min + 4) = 0;
    *(undefined8 *)((long)&pRazorAHRS->magn_z_max + 4) = 0;
    memset(&pRazorAHRS->ccx,0,0xc0);
    pFVar2 = fopen(szCfgFilePath,"r");
    if (pFVar2 == (FILE *)0x0) {
      pcVar3 = "Configuration file not found.";
    }
    else {
      local_960 = &pRazorAHRS->threadperiod;
      local_958 = &pRazorAHRS->bSaveRawData;
      local_950 = &pRazorAHRS->bROSMode;
      local_948 = &pRazorAHRS->bSendCalibration;
      local_940 = &pRazorAHRS->accel_x_min;
      local_938 = &pRazorAHRS->accel_x_max;
      local_930 = &pRazorAHRS->accel_y_min;
      local_928 = &pRazorAHRS->accel_y_max;
      local_920 = &pRazorAHRS->accel_z_min;
      local_918 = &pRazorAHRS->accel_z_max;
      local_910 = &pRazorAHRS->magn_x_min;
      local_908 = &pRazorAHRS->magn_x_max;
      local_900 = &pRazorAHRS->magn_y_min;
      local_8f8 = &pRazorAHRS->magn_y_max;
      local_8f0 = &pRazorAHRS->magn_z_min;
      local_8e8 = &pRazorAHRS->magn_z_max;
      local_8e0 = &pRazorAHRS->calibration_magn_use_extended;
      local_8d0 = &pRazorAHRS->ccy;
      local_8c8 = &pRazorAHRS->ccz;
      local_8c0 = &pRazorAHRS->ctxX;
      local_8b8 = &pRazorAHRS->ctxY;
      local_8b0 = &pRazorAHRS->ctxZ;
      local_8a8 = &pRazorAHRS->ctyX;
      local_8a0 = &pRazorAHRS->ctyY;
      local_898 = &pRazorAHRS->ctyZ;
      local_890 = &pRazorAHRS->ctzX;
      local_888 = &pRazorAHRS->ctzY;
      local_880 = &pRazorAHRS->ctzZ;
      local_878 = &pRazorAHRS->gyro_average_offset_x;
      local_870 = &pRazorAHRS->gyro_average_offset_y;
      local_868 = &pRazorAHRS->gyro_average_offset_z;
      local_860 = &pRazorAHRS->rollorientation;
      local_858 = &pRazorAHRS->rollp1;
      local_850 = &pRazorAHRS->rollp2;
      local_848 = &pRazorAHRS->pitchorientation;
      local_840 = &pRazorAHRS->pitchp1;
      local_978 = &pRazorAHRS->pitchp2;
      local_990 = &pRazorAHRS->yaworientation;
      local_988 = &pRazorAHRS->yawp1;
      local_980 = &pRazorAHRS->yawp2;
      local_8d8 = &pRazorAHRS->ccx;
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001125a3;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001125bb;
        }
        if (local_a98 != 0x23) break;
LAB_001125a3:
        if (pcVar3 == (char *)0x0) goto LAB_001125c0;
      }
      if (local_a98 == 0x24) goto LAB_001125c0;
LAB_001125bb:
      if (pcVar3 == (char *)0x0) {
LAB_001125c0:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%255s",pRazorAHRS->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011263b;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112647;
        }
        if (local_a98 != 0x23) break;
LAB_0011263b:
        if (pcVar3 == (char *)0x0) goto LAB_0011264c;
      }
      if (local_a98 == 0x24) goto LAB_0011264c;
LAB_00112647:
      if (pcVar3 == (char *)0x0) {
LAB_0011264c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",&pRazorAHRS->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001126c7;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001126d3;
        }
        if (local_a98 != 0x23) break;
LAB_001126c7:
        if (pcVar3 == (char *)0x0) goto LAB_001126d8;
      }
      if (local_a98 == 0x24) goto LAB_001126d8;
LAB_001126d3:
      if (pcVar3 == (char *)0x0) {
LAB_001126d8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",&pRazorAHRS->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112753;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_0011275f;
        }
        if (local_a98 != 0x23) break;
LAB_00112753:
        if (pcVar3 == (char *)0x0) goto LAB_00112764;
      }
      if (local_a98 == 0x24) goto LAB_00112764;
LAB_0011275f:
      if (pcVar3 == (char *)0x0) {
LAB_00112764:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",local_960);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001127e4;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001127f0;
        }
        if (local_a98 != 0x23) break;
LAB_001127e4:
        if (pcVar3 == (char *)0x0) goto LAB_001127f5;
      }
      if (local_a98 == 0x24) goto LAB_001127f5;
LAB_001127f0:
      if (pcVar3 == (char *)0x0) {
LAB_001127f5:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",local_958);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112875;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112881;
        }
        if (local_a98 != 0x23) break;
LAB_00112875:
        if (pcVar3 == (char *)0x0) goto LAB_00112886;
      }
      if (local_a98 == 0x24) goto LAB_00112886;
LAB_00112881:
      if (pcVar3 == (char *)0x0) {
LAB_00112886:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",local_950);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112906;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112912;
        }
        if (local_a98 != 0x23) break;
LAB_00112906:
        if (pcVar3 == (char *)0x0) goto LAB_00112917;
      }
      if (local_a98 == 0x24) goto LAB_00112917;
LAB_00112912:
      if (pcVar3 == (char *)0x0) {
LAB_00112917:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",local_948);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112997;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001129a3;
        }
        if (local_a98 != 0x23) break;
LAB_00112997:
        if (pcVar3 == (char *)0x0) goto LAB_001129a8;
      }
      if (local_a98 == 0x24) goto LAB_001129a8;
LAB_001129a3:
      if (pcVar3 == (char *)0x0) {
LAB_001129a8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_940);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112a28;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112a34;
        }
        if (local_a98 != 0x23) break;
LAB_00112a28:
        if (pcVar3 == (char *)0x0) goto LAB_00112a39;
      }
      if (local_a98 == 0x24) goto LAB_00112a39;
LAB_00112a34:
      if (pcVar3 == (char *)0x0) {
LAB_00112a39:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_938);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112ab9;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112ac5;
        }
        if (local_a98 != 0x23) break;
LAB_00112ab9:
        if (pcVar3 == (char *)0x0) goto LAB_00112aca;
      }
      if (local_a98 == 0x24) goto LAB_00112aca;
LAB_00112ac5:
      if (pcVar3 == (char *)0x0) {
LAB_00112aca:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_930);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112b4a;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112b56;
        }
        if (local_a98 != 0x23) break;
LAB_00112b4a:
        if (pcVar3 == (char *)0x0) goto LAB_00112b5b;
      }
      if (local_a98 == 0x24) goto LAB_00112b5b;
LAB_00112b56:
      if (pcVar3 == (char *)0x0) {
LAB_00112b5b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_928);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112bdb;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112be7;
        }
        if (local_a98 != 0x23) break;
LAB_00112bdb:
        if (pcVar3 == (char *)0x0) goto LAB_00112bec;
      }
      if (local_a98 == 0x24) goto LAB_00112bec;
LAB_00112be7:
      if (pcVar3 == (char *)0x0) {
LAB_00112bec:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_920);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112c6c;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112c78;
        }
        if (local_a98 != 0x23) break;
LAB_00112c6c:
        if (pcVar3 == (char *)0x0) goto LAB_00112c7d;
      }
      if (local_a98 == 0x24) goto LAB_00112c7d;
LAB_00112c78:
      if (pcVar3 == (char *)0x0) {
LAB_00112c7d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_918);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112cfd;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112d09;
        }
        if (local_a98 != 0x23) break;
LAB_00112cfd:
        if (pcVar3 == (char *)0x0) goto LAB_00112d0e;
      }
      if (local_a98 == 0x24) goto LAB_00112d0e;
LAB_00112d09:
      if (pcVar3 == (char *)0x0) {
LAB_00112d0e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_910);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112d8e;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112d9a;
        }
        if (local_a98 != 0x23) break;
LAB_00112d8e:
        if (pcVar3 == (char *)0x0) goto LAB_00112d9f;
      }
      if (local_a98 == 0x24) goto LAB_00112d9f;
LAB_00112d9a:
      if (pcVar3 == (char *)0x0) {
LAB_00112d9f:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_908);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112e1f;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112e2b;
        }
        if (local_a98 != 0x23) break;
LAB_00112e1f:
        if (pcVar3 == (char *)0x0) goto LAB_00112e30;
      }
      if (local_a98 == 0x24) goto LAB_00112e30;
LAB_00112e2b:
      if (pcVar3 == (char *)0x0) {
LAB_00112e30:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_900);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112eb0;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112ebc;
        }
        if (local_a98 != 0x23) break;
LAB_00112eb0:
        if (pcVar3 == (char *)0x0) goto LAB_00112ec1;
      }
      if (local_a98 == 0x24) goto LAB_00112ec1;
LAB_00112ebc:
      if (pcVar3 == (char *)0x0) {
LAB_00112ec1:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8f8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112f41;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112f4d;
        }
        if (local_a98 != 0x23) break;
LAB_00112f41:
        if (pcVar3 == (char *)0x0) goto LAB_00112f52;
      }
      if (local_a98 == 0x24) goto LAB_00112f52;
LAB_00112f4d:
      if (pcVar3 == (char *)0x0) {
LAB_00112f52:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8f0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00112fd2;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00112fde;
        }
        if (local_a98 != 0x23) break;
LAB_00112fd2:
        if (pcVar3 == (char *)0x0) goto LAB_00112fe3;
      }
      if (local_a98 == 0x24) goto LAB_00112fe3;
LAB_00112fde:
      if (pcVar3 == (char *)0x0) {
LAB_00112fe3:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8e8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113063;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_0011306f;
        }
        if (local_a98 != 0x23) break;
LAB_00113063:
        if (pcVar3 == (char *)0x0) goto LAB_00113074;
      }
      if (local_a98 == 0x24) goto LAB_00113074;
LAB_0011306f:
      if (pcVar3 == (char *)0x0) {
LAB_00113074:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%d",local_8e0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001130f4;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113100;
        }
        if (local_a98 != 0x23) break;
LAB_001130f4:
        if (pcVar3 == (char *)0x0) goto LAB_00113105;
      }
      if (local_a98 == 0x24) goto LAB_00113105;
LAB_00113100:
      if (pcVar3 == (char *)0x0) {
LAB_00113105:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8d8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113185;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113191;
        }
        if (local_a98 != 0x23) break;
LAB_00113185:
        if (pcVar3 == (char *)0x0) goto LAB_00113196;
      }
      if (local_a98 == 0x24) goto LAB_00113196;
LAB_00113191:
      if (pcVar3 == (char *)0x0) {
LAB_00113196:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8d0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113216;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113222;
        }
        if (local_a98 != 0x23) break;
LAB_00113216:
        if (pcVar3 == (char *)0x0) goto LAB_00113227;
      }
      if (local_a98 == 0x24) goto LAB_00113227;
LAB_00113222:
      if (pcVar3 == (char *)0x0) {
LAB_00113227:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8c8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001132a7;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001132b3;
        }
        if (local_a98 != 0x23) break;
LAB_001132a7:
        if (pcVar3 == (char *)0x0) goto LAB_001132b8;
      }
      if (local_a98 == 0x24) goto LAB_001132b8;
LAB_001132b3:
      if (pcVar3 == (char *)0x0) {
LAB_001132b8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8c0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113338;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113344;
        }
        if (local_a98 != 0x23) break;
LAB_00113338:
        if (pcVar3 == (char *)0x0) goto LAB_00113349;
      }
      if (local_a98 == 0x24) goto LAB_00113349;
LAB_00113344:
      if (pcVar3 == (char *)0x0) {
LAB_00113349:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8b8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001133c9;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001133d5;
        }
        if (local_a98 != 0x23) break;
LAB_001133c9:
        if (pcVar3 == (char *)0x0) goto LAB_001133da;
      }
      if (local_a98 == 0x24) goto LAB_001133da;
LAB_001133d5:
      if (pcVar3 == (char *)0x0) {
LAB_001133da:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8b0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011345a;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113466;
        }
        if (local_a98 != 0x23) break;
LAB_0011345a:
        if (pcVar3 == (char *)0x0) goto LAB_0011346b;
      }
      if (local_a98 == 0x24) goto LAB_0011346b;
LAB_00113466:
      if (pcVar3 == (char *)0x0) {
LAB_0011346b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8a8);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001134eb;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001134f7;
        }
        if (local_a98 != 0x23) break;
LAB_001134eb:
        if (pcVar3 == (char *)0x0) goto LAB_001134fc;
      }
      if (local_a98 == 0x24) goto LAB_001134fc;
LAB_001134f7:
      if (pcVar3 == (char *)0x0) {
LAB_001134fc:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_8a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011357c;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113588;
        }
        if (local_a98 != 0x23) break;
LAB_0011357c:
        if (pcVar3 == (char *)0x0) goto LAB_0011358d;
      }
      if (local_a98 == 0x24) goto LAB_0011358d;
LAB_00113588:
      if (pcVar3 == (char *)0x0) {
LAB_0011358d:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_898);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011360d;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113619;
        }
        if (local_a98 != 0x23) break;
LAB_0011360d:
        if (pcVar3 == (char *)0x0) goto LAB_0011361e;
      }
      if (local_a98 == 0x24) goto LAB_0011361e;
LAB_00113619:
      if (pcVar3 == (char *)0x0) {
LAB_0011361e:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_890);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011369e;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001136aa;
        }
        if (local_a98 != 0x23) break;
LAB_0011369e:
        if (pcVar3 == (char *)0x0) goto LAB_001136af;
      }
      if (local_a98 == 0x24) goto LAB_001136af;
LAB_001136aa:
      if (pcVar3 == (char *)0x0) {
LAB_001136af:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_888);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_0011372f;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_0011373b;
        }
        if (local_a98 != 0x23) break;
LAB_0011372f:
        if (pcVar3 == (char *)0x0) goto LAB_00113740;
      }
      if (local_a98 == 0x24) goto LAB_00113740;
LAB_0011373b:
      if (pcVar3 == (char *)0x0) {
LAB_00113740:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_880);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001137c0;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001137cc;
        }
        if (local_a98 != 0x23) break;
LAB_001137c0:
        if (pcVar3 == (char *)0x0) goto LAB_001137d1;
      }
      if (local_a98 == 0x24) goto LAB_001137d1;
LAB_001137cc:
      if (pcVar3 == (char *)0x0) {
LAB_001137d1:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_878);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113851;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_0011385d;
        }
        if (local_a98 != 0x23) break;
LAB_00113851:
        if (pcVar3 == (char *)0x0) goto LAB_00113862;
      }
      if (local_a98 == 0x24) goto LAB_00113862;
LAB_0011385d:
      if (pcVar3 == (char *)0x0) {
LAB_00113862:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_870);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_001138e2;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_001138ee;
        }
        if (local_a98 != 0x23) break;
LAB_001138e2:
        if (pcVar3 == (char *)0x0) goto LAB_001138f3;
      }
      if (local_a98 == 0x24) goto LAB_001138f3;
LAB_001138ee:
      if (pcVar3 == (char *)0x0) {
LAB_001138f3:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_868);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113973;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_0011397f;
        }
        if (local_a98 != 0x23) break;
LAB_00113973:
        if (pcVar3 == (char *)0x0) goto LAB_00113984;
      }
      if (local_a98 == 0x24) goto LAB_00113984;
LAB_0011397f:
      if (pcVar3 == (char *)0x0) {
LAB_00113984:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_860);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113a04;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113a10;
        }
        if (local_a98 != 0x23) break;
LAB_00113a04:
        if (pcVar3 == (char *)0x0) goto LAB_00113a15;
      }
      if (local_a98 == 0x24) goto LAB_00113a15;
LAB_00113a10:
      if (pcVar3 == (char *)0x0) {
LAB_00113a15:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_858);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113a95;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113aa1;
        }
        if (local_a98 != 0x23) break;
LAB_00113a95:
        if (pcVar3 == (char *)0x0) goto LAB_00113aa6;
      }
      if (local_a98 == 0x24) goto LAB_00113aa6;
LAB_00113aa1:
      if (pcVar3 == (char *)0x0) {
LAB_00113aa6:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_850);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113b26;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113b32;
        }
        if (local_a98 != 0x23) break;
LAB_00113b26:
        if (pcVar3 == (char *)0x0) goto LAB_00113b37;
      }
      if (local_a98 == 0x24) goto LAB_00113b37;
LAB_00113b32:
      if (pcVar3 == (char *)0x0) {
LAB_00113b37:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_848);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113bb7;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113bc3;
        }
        if (local_a98 != 0x23) break;
LAB_00113bb7:
        if (pcVar3 == (char *)0x0) goto LAB_00113bc8;
      }
      if (local_a98 == 0x24) goto LAB_00113bc8;
LAB_00113bc3:
      if (pcVar3 == (char *)0x0) {
LAB_00113bc8:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_840);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113c48;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113c54;
        }
        if (local_a98 != 0x23) break;
LAB_00113c48:
        if (pcVar3 == (char *)0x0) goto LAB_00113c59;
      }
      if (local_a98 == 0x24) goto LAB_00113c59;
LAB_00113c54:
      if (pcVar3 == (char *)0x0) {
LAB_00113c59:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_978);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113cd9;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113ce5;
        }
        if (local_a98 != 0x23) break;
LAB_00113cd9:
        if (pcVar3 == (char *)0x0) goto LAB_00113cea;
      }
      if (local_a98 == 0x24) goto LAB_00113cea;
LAB_00113ce5:
      if (pcVar3 == (char *)0x0) {
LAB_00113cea:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_990);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113d6a;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113d76;
        }
        if (local_a98 != 0x23) break;
LAB_00113d6a:
        if (pcVar3 == (char *)0x0) goto LAB_00113d7b;
      }
      if (local_a98 == 0x24) goto LAB_00113d7b;
LAB_00113d76:
      if (pcVar3 == (char *)0x0) {
LAB_00113d7b:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_988);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      while( true ) {
        while (pcVar3 = fgets((char *)&local_a98,0x100,pFVar2), 0x24 < local_a98) {
          if (local_a98 == 0x25) goto LAB_00113dfb;
          if (((local_a98 != 0x2f) || (pcVar3 == (char *)0x0)) || (local_a97 != '/'))
          goto LAB_00113e07;
        }
        if (local_a98 != 0x23) break;
LAB_00113dfb:
        if (pcVar3 == (char *)0x0) goto LAB_00113e0c;
      }
      if (local_a98 == 0x24) goto LAB_00113e0c;
LAB_00113e07:
      if (pcVar3 == (char *)0x0) {
LAB_00113e0c:
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_a98,"%lf",local_980);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(pFVar2);
      if (iVar1 == 0) goto LAB_00113e5f;
      pcVar3 = "fclose() failed.";
    }
    puts(pcVar3);
  }
LAB_00113e5f:
  if (pRazorAHRS->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pRazorAHRS->threadperiod = 0x32;
  }
  (pRazorAHRS->LastRazorAHRSData).Pitch = 0.0;
  (pRazorAHRS->LastRazorAHRSData).Yaw = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyrz = 0.0;
  (pRazorAHRS->LastRazorAHRSData).Roll = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyrx = 0.0;
  (pRazorAHRS->LastRazorAHRSData).gyry = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accy = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accz = 0.0;
  (pRazorAHRS->LastRazorAHRSData).roll = 0.0;
  (pRazorAHRS->LastRazorAHRSData).accx = 0.0;
  (pRazorAHRS->LastRazorAHRSData).yaw = 0.0;
  (pRazorAHRS->LastRazorAHRSData).pitch = 0.0;
  iVar1 = OpenRS232Port(&pRazorAHRS->RS232Port,pRazorAHRS->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a RazorAHRS.");
    return 1;
  }
  iVar1 = (pRazorAHRS->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          ((pRazorAHRS->RS232Port).hDev,pRazorAHRS->BaudRate,'\0',0,'\b','\x02',
                           pRazorAHRS->timeout), iVar1 != 0)) {
      pcVar3 = "Unable to connect to a RazorAHRS.";
      goto LAB_00114369;
    }
    tcflush(*(int *)&(pRazorAHRS->RS232Port).hDev,2);
  }
  if (pRazorAHRS->bSendCalibration != 0) {
    memset(local_838,0,0x800);
    if (pRazorAHRS->calibration_magn_use_extended == 0) {
      pcVar3 = 
      "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#cgx%.4f#cgy%.4f#cgz%.4f"
      ;
    }
    else {
      local_978 = (double *)pRazorAHRS->ccx;
      dStack_970 = pRazorAHRS->ccy;
      pcVar3 = 
      "#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f#ccx%.4f#ccy%.4f#ccz%.4f#ctxX%.4f#ctxY%.4f#ctxZ%.4f#ctyX%.4f#ctyY%.4f#ctyZ%.4f#ctzX%.4f#ctzY%.4f#ctzZ%.4f#cgx%.4f#cgy%.4f#cgz%.4f"
      ;
      local_990 = (double *)pRazorAHRS->accel_x_min;
      local_988 = (double *)pRazorAHRS->magn_x_max;
      local_980 = (double *)pRazorAHRS->magn_x_min;
    }
    sprintf(local_838,pcVar3,(int)(double *)pRazorAHRS->accel_x_min,pRazorAHRS->accel_x_max,
            pRazorAHRS->accel_y_min,pRazorAHRS->accel_y_max,pRazorAHRS->accel_z_min,
            pRazorAHRS->accel_z_max,(double *)pRazorAHRS->magn_x_min,
            (int)(double *)pRazorAHRS->magn_x_max);
    sVar4 = strlen(local_838);
    iVar1 = (pRazorAHRS->RS232Port).DevType;
    uVar6 = (uint)sVar4;
    if (iVar1 - 1U < 4) {
      if (0 < (int)uVar6) {
        iVar1 = (pRazorAHRS->RS232Port).s;
        uVar7 = 0;
        do {
          sVar5 = send(iVar1,local_838 + uVar7,(long)(int)(uVar6 - (int)uVar7),0);
          if ((int)sVar5 < 1) goto LAB_00114216;
          uVar8 = (int)uVar7 + (int)sVar5;
          uVar7 = (ulong)uVar8;
        } while ((int)uVar8 < (int)uVar6);
      }
    }
    else {
      if (iVar1 != 0) {
LAB_00114216:
        pcVar3 = "Unable to connect to a RazorAHRS : Failed to send calibration data.";
        goto LAB_00114369;
      }
      if (uVar6 != 0) {
        iVar1 = *(int *)&(pRazorAHRS->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar5 = write(iVar1,local_838 + uVar7,(ulong)(uVar6 - (int)uVar7));
          if ((int)sVar5 < 1) goto LAB_00114216;
          uVar8 = (int)uVar7 + (int)sVar5;
          uVar7 = (ulong)uVar8;
        } while (uVar8 < uVar6);
      }
    }
    if ((pRazorAHRS->bSaveRawData != 0) &&
       (pFVar2 = (FILE *)pRazorAHRS->pfSaveFile, pFVar2 != (FILE *)0x0)) {
      sVar4 = strlen(local_838);
      fwrite(local_838,sVar4,1,pFVar2);
      fflush((FILE *)pRazorAHRS->pfSaveFile);
    }
  }
  if (pRazorAHRS->bROSMode == 0) goto LAB_00114352;
  iVar1 = (pRazorAHRS->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if (iVar1 == 0) {
      iVar1 = *(int *)&(pRazorAHRS->RS232Port).hDev;
      uVar7 = 0;
      do {
        sVar5 = write(iVar1,"#ox" + uVar7,(ulong)(3 - (int)uVar7));
        if ((int)sVar5 < 1) goto LAB_00114362;
        uVar6 = (int)uVar7 + (int)sVar5;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < 3);
      goto LAB_0011425c;
    }
LAB_00114362:
    pcVar3 = "Unable to connect to a RazorAHRS : Initialization failure.";
LAB_00114369:
    puts(pcVar3);
    CloseRS232Port(&pRazorAHRS->RS232Port);
    return 1;
  }
  iVar1 = (pRazorAHRS->RS232Port).s;
  uVar7 = 0;
  do {
    sVar5 = send(iVar1,"#ox" + uVar7,(ulong)(3 - (int)uVar7),0);
    if ((int)sVar5 < 1) goto LAB_00114362;
    uVar6 = (int)uVar7 + (int)sVar5;
    uVar7 = (ulong)uVar6;
  } while ((int)uVar6 < 3);
LAB_0011425c:
  if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
    fwrite("#ox",3,1,(FILE *)pRazorAHRS->pfSaveFile);
    fflush((FILE *)pRazorAHRS->pfSaveFile);
  }
  iVar1 = (pRazorAHRS->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRazorAHRS->RS232Port).s;
    uVar7 = 0;
    do {
      sVar5 = send(iVar1,"#o1" + uVar7,(ulong)(3 - (int)uVar7),0);
      if ((int)sVar5 < 1) goto LAB_00114362;
      uVar6 = (int)uVar7 + (int)sVar5;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 < 3);
  }
  else {
    if (iVar1 != 0) goto LAB_00114362;
    iVar1 = *(int *)&(pRazorAHRS->RS232Port).hDev;
    uVar7 = 0;
    do {
      sVar5 = write(iVar1,"#o1" + uVar7,(ulong)(3 - (int)uVar7));
      if ((int)sVar5 < 1) goto LAB_00114362;
      uVar6 = (int)uVar7 + (int)sVar5;
      uVar7 = (ulong)uVar6;
    } while (uVar6 < 3);
  }
  if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
    fwrite("#o1",3,1,(FILE *)pRazorAHRS->pfSaveFile);
    fflush((FILE *)pRazorAHRS->pfSaveFile);
  }
LAB_00114352:
  puts("RazorAHRS connected.");
  return 0;
}

Assistant:

inline int ConnectRazorAHRS(RAZORAHRS* pRazorAHRS, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* outputmodebuf = "#ox";
	char* streammodebuf = "#o1";
	char calibbuf[2048];

	memset(pRazorAHRS->szCfgFilePath, 0, sizeof(pRazorAHRS->szCfgFilePath));
	sprintf(pRazorAHRS->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRazorAHRS->szDevPath, 0, sizeof(pRazorAHRS->szDevPath));
		sprintf(pRazorAHRS->szDevPath, "COM1");
		pRazorAHRS->BaudRate = 57600;
		pRazorAHRS->timeout = 2000;
		pRazorAHRS->threadperiod = 50;
		pRazorAHRS->bSaveRawData = 1;
		pRazorAHRS->bROSMode = 1;
		pRazorAHRS->bSendCalibration = 0;
		pRazorAHRS->accel_x_min = 0; pRazorAHRS->accel_x_max = 0;
		pRazorAHRS->accel_y_min = 0; pRazorAHRS->accel_y_max = 0;
		pRazorAHRS->accel_z_min = 0; pRazorAHRS->accel_z_max = 0;
		pRazorAHRS->magn_x_min = 0; pRazorAHRS->magn_x_max = 0;
		pRazorAHRS->magn_y_min = 0; pRazorAHRS->magn_y_max = 0;
		pRazorAHRS->magn_z_min = 0; pRazorAHRS->magn_z_max = 0;
		pRazorAHRS->calibration_magn_use_extended = 0;
		pRazorAHRS->ccx = 0; pRazorAHRS->ccy = 0; pRazorAHRS->ccz = 0;
		pRazorAHRS->ctxX = 0; pRazorAHRS->ctxY = 0; pRazorAHRS->ctxZ = 0;
		pRazorAHRS->ctyX = 0; pRazorAHRS->ctyY = 0; pRazorAHRS->ctyZ = 0;
		pRazorAHRS->ctzX = 0; pRazorAHRS->ctzY = 0; pRazorAHRS->ctzZ = 0;
		pRazorAHRS->gyro_average_offset_x = 0; pRazorAHRS->gyro_average_offset_y = 0; pRazorAHRS->gyro_average_offset_z = 0;
		pRazorAHRS->rollorientation = 0;
		pRazorAHRS->rollp1 = 0;
		pRazorAHRS->rollp2 = 0;
		pRazorAHRS->pitchorientation = 0;
		pRazorAHRS->pitchp1 = 0;
		pRazorAHRS->pitchp2 = 0;
		pRazorAHRS->yaworientation = 0;
		pRazorAHRS->yawp1 = 0;
		pRazorAHRS->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRazorAHRS->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bROSMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->bSendCalibration) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->accel_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_x_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_y_max) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_min) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->magn_z_max) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRazorAHRS->calibration_magn_use_extended) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccx) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccy) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ccz) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctxZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctyZ) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzX) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzY) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->ctzZ) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_x) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_y) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->gyro_average_offset_z) != 1) printf("Invalid configuration file.\n");

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pRazorAHRS->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRazorAHRS->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRazorAHRS->threadperiod = 50;
	}

	// Used to save raw data, should be handled specifically...
	//pRazorAHRS->pfSaveFile = NULL;

	memset(&pRazorAHRS->LastRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (OpenRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRazorAHRS->RS232Port, pRazorAHRS->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pRazorAHRS->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRS.\n");
		CloseRS232Port(&pRazorAHRS->RS232Port);
		return EXIT_FAILURE;
	}

	if (pRazorAHRS->bSendCalibration)
	{
		memset(calibbuf, 0, sizeof(calibbuf));
		if (pRazorAHRS->calibration_magn_use_extended)
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#ccx%.4f#ccy%.4f#ccz%.4f"
				"#ctxX%.4f#ctxY%.4f#ctxZ%.4f"
				"#ctyX%.4f#ctyY%.4f#ctyZ%.4f"
				"#ctzX%.4f#ctzY%.4f#ctzZ%.4f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->ccx, pRazorAHRS->ccy, pRazorAHRS->ccz,
				pRazorAHRS->ctxX, pRazorAHRS->ctxY, pRazorAHRS->ctxZ,
				pRazorAHRS->ctyX, pRazorAHRS->ctyY, pRazorAHRS->ctyZ,
				pRazorAHRS->ctzX, pRazorAHRS->ctzY, pRazorAHRS->ctzZ,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		else
		{
			sprintf(calibbuf,
				"#caxm%.2f#caxM%.2f#caym%.2f#cayM%.2f#cazm%.2f#cazM%.2f"
				"#cmxm%.2f#cmxM%.2f#cmym%.2f#cmyM%.2f#cmzm%.2f#cmzM%.2f"
				"#cgx%.4f#cgy%.4f#cgz%.4f",
				pRazorAHRS->accel_x_min, pRazorAHRS->accel_x_max, pRazorAHRS->accel_y_min, pRazorAHRS->accel_y_max, pRazorAHRS->accel_z_min, pRazorAHRS->accel_z_max,
				pRazorAHRS->magn_x_min, pRazorAHRS->magn_x_max, pRazorAHRS->magn_y_min, pRazorAHRS->magn_y_max, pRazorAHRS->magn_z_min, pRazorAHRS->magn_z_max,
				pRazorAHRS->gyro_average_offset_x, pRazorAHRS->gyro_average_offset_y, pRazorAHRS->gyro_average_offset_z);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)calibbuf, (int)strlen(calibbuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Failed to send calibration data.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
		{
			fwrite(calibbuf, strlen(calibbuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	if (pRazorAHRS->bROSMode)
	{
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)outputmodebuf, (int)strlen(outputmodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(outputmodebuf, strlen(outputmodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		if (WriteAllRS232Port(&pRazorAHRS->RS232Port, (uint8*)streammodebuf, (int)strlen(streammodebuf)) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a RazorAHRS : Initialization failure.\n");
			CloseRS232Port(&pRazorAHRS->RS232Port);
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite(streammodebuf, strlen(streammodebuf), 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
	}

	printf("RazorAHRS connected.\n");

	return EXIT_SUCCESS;
}